

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglnativeinterfacehandler.cpp
# Opt level: O1

NativeResourceForWindowFunction __thiscall
QXcbEglNativeInterfaceHandler::nativeResourceFunctionForWindow
          (QXcbEglNativeInterfaceHandler *this,QByteArray *resource)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = resourceType(resource);
  pcVar2 = (NativeResourceForWindowFunction)0x0;
  if (iVar1 == 0) {
    pcVar2 = eglDisplayForWindow;
  }
  return pcVar2;
}

Assistant:

QPlatformNativeInterface::NativeResourceForWindowFunction QXcbEglNativeInterfaceHandler::nativeResourceFunctionForWindow(const QByteArray &resource) const
{
    switch (resourceType(resource)) {
    case EglDisplay:
        return eglDisplayForWindow;
    default:
        break;
    }
    return nullptr;
}